

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::update_auto_sequential(torrent *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  session_settings *this_00;
  bool local_21;
  int seeds;
  int downloaders;
  torrent *this_local;
  
  this_00 = settings(this);
  bVar1 = session_settings::get_bool(this_00,0x8042);
  if (bVar1) {
    iVar2 = num_peers(this);
    if ((int)(iVar2 - (uint)this->m_num_connecting) < 10) {
      this->field_0x5cc = this->field_0x5cc & 0xfd;
    }
    else {
      iVar2 = num_downloaders(this);
      iVar3 = num_seeds(this);
      local_21 = iVar2 * 10 <= iVar3 && 9 < iVar3;
      this->field_0x5cc = this->field_0x5cc & 0xfd | local_21 << 1;
    }
  }
  else {
    this->field_0x5cc = this->field_0x5cc & 0xfd;
  }
  return;
}

Assistant:

void torrent::update_auto_sequential()
	{
		if (!settings().get_bool(settings_pack::auto_sequential))
		{
			m_auto_sequential = false;
			return;
		}

		if (num_peers() - m_num_connecting < 10)
		{
			// there are too few peers. Be conservative and don't assume it's
			// well seeded until we can connect to more peers
			m_auto_sequential = false;
			return;
		}

		// if there are at least 10 seeds, and there are 10 times more
		// seeds than downloaders, enter sequential download mode
		// (for performance)
		int const downloaders = num_downloaders();
		int const seeds = num_seeds();
		m_auto_sequential = downloaders * 10 <= seeds
			&& seeds > 9;
	}